

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_reader.cc
# Opt level: O0

string * __thiscall
pstack::Dwarf::DWARFReader::readFormString_abi_cxx11_
          (string *__return_storage_ptr__,DWARFReader *this,Info *dwarf,Unit *unit,Form form)

{
  element_type *peVar1;
  Exception *this_00;
  Exception *pEVar2;
  Exception local_218;
  uintmax_t local_78;
  size_t off_2;
  Object *local_60;
  uintmax_t off_1;
  undefined1 local_48 [24];
  uintmax_t off;
  Unit *pUStack_28;
  Form form_local;
  Unit *unit_local;
  Info *dwarf_local;
  DWARFReader *this_local;
  
  off._4_4_ = form;
  pUStack_28 = unit;
  unit_local = (Unit *)dwarf;
  dwarf_local = (Info *)this;
  this_local = (DWARFReader *)__return_storage_ptr__;
  switch(form) {
  case DW_FORM_string:
    getstring_abi_cxx11_(__return_storage_ptr__,this);
    break;
  default:
    this_00 = (Exception *)__cxa_allocate_exception();
    memset(&local_218,0,0x1a0);
    Exception::Exception(&local_218);
    pEVar2 = Exception::operator<<(&local_218,(char (*) [16])"unhandled form ");
    pEVar2 = Exception::operator<<(pEVar2,(Form *)((long)&off + 4));
    pEVar2 = Exception::operator<<(pEVar2,(char (*) [21])" when reading string");
    Exception::Exception(this_00,pEVar2);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  case DW_FORM_strp:
    local_60 = (Object *)getuint(this,unit->dwarfLen);
    Elf::Section::io((Section *)&off_2);
    peVar1 = std::
             __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&off_2);
    (*peVar1->_vptr_Reader[7])(__return_storage_ptr__,peVar1,local_60);
    std::shared_ptr<const_pstack::Reader>::~shared_ptr((shared_ptr<const_pstack::Reader> *)&off_2);
    break;
  case DW_FORM_strx:
    local_78 = getuleb128(this);
    Unit::strx_abi_cxx11_(__return_storage_ptr__,pUStack_28,local_78);
    break;
  case DW_FORM_line_strp:
    local_48._16_8_ = getuint(this,unit->dwarfLen);
    Elf::Section::io((Section *)local_48);
    peVar1 = std::
             __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
    (*peVar1->_vptr_Reader[7])(__return_storage_ptr__,peVar1,local_48._16_8_);
    std::shared_ptr<const_pstack::Reader>::~shared_ptr((shared_ptr<const_pstack::Reader> *)local_48)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
DWARFReader::readFormString(const Info &dwarf, Unit &unit, Form form)
{
    switch (form) {
        case DW_FORM_string:
            return getstring();
        case DW_FORM_line_strp: {
            auto off = getuint(unit.dwarfLen);
            return dwarf.debugLineStrings.io()->readString(off);
        }
        case DW_FORM_strp: {
            auto off = getuint(unit.dwarfLen);
            return dwarf.debugStrings.io()->readString(off);
        }
        case DW_FORM_strx: {
            size_t off = getuleb128();
            return unit.strx(off);
        }
        default: {
            throw (Exception() << "unhandled form " << form << " when reading string");
        }
    }
}